

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int biomesToImage(uchar *pixels,uchar (*biomeColors) [3],int *biomes,uint sx,uint sy,uint pixscale,
                 int flip)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uchar uVar5;
  uint uVar6;
  ulong uVar7;
  uchar uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uchar uVar12;
  int local_54;
  
  if (sy == 0) {
    local_54 = 0;
  }
  else {
    uVar2 = 0;
    local_54 = 0;
    do {
      if (sx != 0) {
        uVar9 = ~uVar2 + sy;
        if (flip != 0) {
          uVar9 = uVar2;
        }
        iVar10 = uVar9 * pixscale * pixscale * sx * 3;
        uVar7 = 0;
        do {
          uVar4 = (ulong)(uint)biomes[uVar2 * sx + (int)uVar7];
          if (uVar4 < 0x100) {
            uVar8 = biomeColors[uVar4][0];
            uVar5 = biomeColors[uVar4][1];
            uVar12 = biomeColors[uVar4][2];
          }
          else {
            uVar3 = biomes[uVar2 * sx + (int)uVar7] & 0x7f;
            uVar9 = biomeColors[uVar3][0] - 0x28;
            uVar6 = biomeColors[uVar3][1] - 0x28;
            uVar3 = biomeColors[uVar3][2] - 0x28;
            if (0xff < uVar9) {
              uVar9 = 0;
            }
            uVar8 = (uchar)uVar9;
            if (0xff < uVar6) {
              uVar6 = 0;
            }
            uVar5 = (uchar)uVar6;
            if (0xff < uVar3) {
              uVar3 = 0;
            }
            uVar12 = (uchar)uVar3;
            local_54 = 1;
          }
          if (pixscale != 0) {
            uVar6 = 0;
            uVar9 = pixscale;
            iVar11 = iVar10;
            iVar1 = iVar10;
            do {
              do {
                pixels[iVar11] = uVar8;
                pixels[(long)iVar11 + 1] = uVar5;
                pixels[(long)iVar11 + 2] = uVar12;
                uVar9 = uVar9 - 1;
                iVar11 = iVar11 + 3;
              } while (uVar9 != 0);
              uVar6 = uVar6 + 1;
              iVar11 = iVar1 + pixscale * 3 * sx;
              uVar9 = pixscale;
              iVar1 = iVar11;
            } while (uVar6 != pixscale);
          }
          uVar7 = uVar7 + 1;
          iVar10 = iVar10 + pixscale * 3;
        } while (uVar7 != sx);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != sy);
  }
  return local_54;
}

Assistant:

int biomesToImage(unsigned char *pixels,
        unsigned char biomeColors[256][3], const int *biomes,
        const unsigned int sx, const unsigned int sy,
        const unsigned int pixscale, const int flip)
{
    unsigned int i, j;
    int containsInvalidBiomes = 0;

    for (j = 0; j < sy; j++)
    {
        for (i = 0; i < sx; i++)
        {
            int id = biomes[j*sx+i];
            unsigned int r, g, b;

            if (id < 0 || id >= 256)
            {
                // This may happen for some intermediate layers
                containsInvalidBiomes = 1;
                r = biomeColors[id&0x7f][0]-40; r = (r>0xff) ? 0x00 : r&0xff;
                g = biomeColors[id&0x7f][1]-40; g = (g>0xff) ? 0x00 : g&0xff;
                b = biomeColors[id&0x7f][2]-40; b = (b>0xff) ? 0x00 : b&0xff;
            }
            else
            {
                r = biomeColors[id][0];
                g = biomeColors[id][1];
                b = biomeColors[id][2];
            }

            unsigned int m, n;
            for (m = 0; m < pixscale; m++) {
                for (n = 0; n < pixscale; n++) {
                    int idx = pixscale * i + n;
                    if (flip)
                        idx += (sx * pixscale) * ((pixscale * j) + m);
                    else
                        idx += (sx * pixscale) * ((pixscale * (sy-1-j)) + m);

                    unsigned char *pix = pixels + 3*idx;
                    pix[0] = (unsigned char)r;
                    pix[1] = (unsigned char)g;
                    pix[2] = (unsigned char)b;
                }
            }
        }
    }

    return containsInvalidBiomes;
}